

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<Replace*>,long_long>
               (reverse_iterator<Replace_*> first,longlong n,reverse_iterator<Replace_*> d_first)

{
  Replace *pRVar1;
  Data *pDVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  int *piVar7;
  Replace *pRVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Replace *pRVar11;
  Replace *pRVar12;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (Replace *)((d_first.current)->in).d.d;
  pRVar11 = local_38.end.current + -n;
  pRVar1 = (Replace *)((first.current)->in).d.d;
  pRVar12 = pRVar1;
  pRVar8 = pRVar11;
  if (pRVar11 < pRVar1) {
    pRVar12 = pRVar11;
    pRVar8 = pRVar1;
  }
  pRVar1 = (Replace *)((d_first.current)->in).d.d;
  while (pRVar1 != pRVar8) {
    pDVar2 = ((first.current)->in).d.d;
    uVar3 = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    *(undefined8 *)&pRVar1[-1].in.d.d = uVar3;
    pcVar4 = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pRVar1[-1].in.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pRVar1[-1].in.d.size = qVar5;
    pDVar6 = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pRVar1[-1].out.d.d = pDVar6;
    pcVar4 = *(char16_t **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pRVar1[-1].out.d.ptr = pcVar4;
    qVar5 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = 0;
    pRVar1[-1].out.d.size = qVar5;
    ((d_first.current)->in).d.d = ((d_first.current)->in).d.d + -3;
    ((first.current)->in).d.d = ((first.current)->in).d.d + -3;
    pRVar1 = (Replace *)((d_first.current)->in).d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current = (Replace *)((d_first.current)->in).d.d;
  while (pRVar1 = (Replace *)((d_first.current)->in).d.d, pRVar1 != pRVar11) {
    pDVar2 = ((first.current)->in).d.d;
    uVar3 = *(undefined8 *)&pRVar1[-1].in.d.d;
    *(undefined8 *)&pRVar1[-1].in.d.d = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (QBasicAtomicInt)(int)uVar3;
    pDVar2[-3].super_QArrayData.flags = (ArrayOptions)(int)((ulong)uVar3 >> 0x20);
    pcVar4 = pRVar1[-1].in.d.ptr;
    pRVar1[-1].in.d.ptr = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar9 = *(undefined4 *)&pRVar1[-1].in.d.size;
    uVar10 = *(undefined4 *)((long)&pRVar1[-1].in.d.size + 4);
    pRVar1[-1].in.d.size = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)uVar9;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)uVar10;
    pDVar6 = pRVar1[-1].out.d.d;
    pRVar1[-1].out.d.d = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = (qsizetype)pDVar6;
    pcVar4 = pRVar1[-1].out.d.ptr;
    pRVar1[-1].out.d.ptr = *(char16_t **)&pDVar2[-1].super_QArrayData;
    *(char16_t **)&pDVar2[-1].super_QArrayData = pcVar4;
    qVar5 = pRVar1[-1].out.d.size;
    pRVar1[-1].out.d.size = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = qVar5;
    ((d_first.current)->in).d.d = ((d_first.current)->in).d.d + -3;
    ((first.current)->in).d.d = ((first.current)->in).d.d + -3;
  }
  while (pRVar1 = (Replace *)((first.current)->in).d.d, pRVar1 != pRVar12) {
    ((first.current)->in).d.d = (Data *)(pRVar1 + 1);
    pDVar2 = (pRVar1->out).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pRVar1->out).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar7 = *(int **)&(pRVar1->in).d.d;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pRVar1->in).d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<Replace_*>,_long_long>::Destructor::
  ~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}